

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

TileCoord __thiscall Imf_3_4::DeepTiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  ulong uVar1;
  LineOrder LVar2;
  LevelMode LVar3;
  ArgExc *this_00;
  ulong uVar4;
  LogicExc *this_01;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  TileCoord TVar9;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  uVar1._0_4_ = a->dx;
  uVar1._4_4_ = a->dy;
  uVar7 = *(ulong *)&a->lx;
  uVar5 = uVar1 >> 0x20;
  LVar2 = this->lineOrder;
  iVar6 = (int)uVar7;
  if (LVar2 == INCREASING_Y) {
    uVar4 = (ulong)((undefined4)uVar1 + 1);
    if (this->numXTiles[iVar6] <= (int)((undefined4)uVar1 + 1)) {
      uVar5 = (ulong)(uVar1._4_4_ + 1);
      uVar4 = 0;
      if (this->numYTiles[(long)uVar7 >> 0x20] <= (int)(uVar1._4_4_ + 1)) {
        LVar3 = (this->tileDesc).mode;
        uVar4 = 0;
        if (LVar3 < RIPMAP_LEVELS) {
          uVar7 = (uVar7 & 0xffffffff00000000 | (ulong)(iVar6 + 1)) + 0x100000000;
        }
        else {
          if (LVar3 != RIPMAP_LEVELS) {
            uVar5 = 0;
            if (LVar3 == NUM_LEVELMODES) {
              this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::LogicExc::LogicExc(this_01,"unknown level mode computing nextTileCoord");
LAB_001753ee:
              __cxa_throw(this_01,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
            }
            goto LAB_001754cd;
          }
          uVar1 = uVar7 + 1;
          uVar5 = uVar7 & 0xffffffff00000000;
          uVar7 = uVar5 + 0x100000000;
          if ((int)uVar1 < this->numXLevels) {
            uVar7 = uVar1 & 0xffffffff | uVar5;
          }
        }
        uVar5 = 0;
      }
    }
  }
  else if (LVar2 == DECREASING_Y) {
    uVar4 = (ulong)((undefined4)uVar1 + 1);
    if (this->numXTiles[iVar6] <= (int)((undefined4)uVar1 + 1)) {
      uVar5 = (ulong)(uVar1._4_4_ - 1);
      uVar4 = 0;
      if (uVar1._4_4_ == 0 || (long)uVar1 < 0) {
        LVar3 = (this->tileDesc).mode;
        if (LVar3 < RIPMAP_LEVELS) {
          uVar7 = (uVar7 & 0xffffffff00000000 | (ulong)(iVar6 + 1)) + 0x100000000;
        }
        else if (LVar3 == RIPMAP_LEVELS) {
          uVar1 = uVar7 + 1;
          uVar8 = uVar7 & 0xffffffff00000000;
          uVar7 = uVar8 + 0x100000000;
          if ((int)uVar1 < this->numXLevels) {
            uVar7 = uVar1 & 0xffffffff | uVar8;
          }
        }
        else if (LVar3 == NUM_LEVELMODES) {
          this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::LogicExc::LogicExc(this_01,"unknown level mode computing nextTileCoord");
          goto LAB_001753ee;
        }
        if ((int)(uVar7 >> 0x20) < this->numYLevels) {
          uVar5 = (ulong)(this->numYTiles[(long)uVar7 >> 0x20] - 1);
          uVar4 = 0;
        }
      }
    }
  }
  else {
    uVar4 = uVar1;
    if (LVar2 == RANDOM_Y) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      std::operator<<(local_188,
                      "can\'t compute next tile from randomly ordered image: use getTilesInOrder instead"
                     );
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
LAB_001754cd:
  TVar9._0_8_ = uVar4 & 0xffffffff | uVar5 << 0x20;
  TVar9.lx = (int)uVar7;
  TVar9.ly = (int)(uVar7 >> 0x20);
  return TVar9;
}

Assistant:

TileCoord
DeepTiledOutputFile::Data::nextTileCoord (const TileCoord& a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw IEX_NAMESPACE::LogicExc (
                            "unknown level mode computing nextTileCoord");
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw IEX_NAMESPACE::LogicExc (
                            "unknown level mode computing nextTileCoord");
                }

                if (b.ly < numYLevels) b.dy = numYTiles[b.ly] - 1;
            }
        }
    }
    else if (lineOrder == RANDOM_Y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "can't compute next tile from randomly ordered image: use getTilesInOrder instead");
    }

    return b;
}